

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  ulong uVar1;
  uint8_t *puVar2;
  long lVar3;
  byte bVar4;
  size_t sVar5;
  uint8_t *puVar6;
  size_t startIndex;
  sysbvm_tuple_t orderedCollection;
  sysbvm_tokenKind_t sVar7;
  _Bool _Var8;
  ulong uVar9;
  sysbvm_tuple_t sVar10;
  sysbvm_tuple_t sVar11;
  uint c;
  sysbvm_tokenKind_t sVar12;
  ulong endIndex;
  char *cstring;
  code *tokenConversionFunction;
  uint uVar13;
  ulong uVar14;
  anon_struct_16_2_4aef7a3d gcFrame;
  sysbvm_scannerState_t local_b8;
  sysbvm_scannerState_t local_90;
  uint local_6c;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  local_40 = &local_68;
  local_68 = 0;
  sStack_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  sysbvm_stackFrame_pushRecord(&local_58);
  sysbvm_gc_lock(context);
  local_68 = sysbvm_orderedCollection_create(context);
  if ((((sourceCode & 0xf) == 0 && sourceCode != 0) &&
      (uVar9 = *(ulong *)(sourceCode + 0x10), (uVar9 & 0xf) == 0 && uVar9 != 0)) &&
     ((*(uint *)(uVar9 + 8) & 0x300) == 0x200)) {
    local_90.text = (uint8_t *)(uVar9 + 0x10);
    local_90.size = (size_t)*(uint *)(uVar9 + 0xc);
    local_90.position = 0;
    local_90.sourceCode = sourceCode;
    if (local_90.size != 0) {
LAB_0013e83e:
      orderedCollection = local_68;
      sVar5 = local_90.size;
      puVar6 = local_90.text;
      uVar9 = local_90.position;
      do {
        uVar14 = uVar9;
        if (uVar9 < local_90.size) {
          while (uVar14 = uVar9, local_90.text[uVar9] < 0x21) {
            uVar9 = uVar9 + 1;
            local_90.position = uVar9;
            if (local_90.size == uVar9) goto LAB_0013fba4;
          }
        }
        startIndex = local_90.position;
        if (local_90.size <= uVar14) break;
        bVar4 = local_90.text[uVar14];
        uVar13 = (uint)bVar4;
        if ((bVar4 != 0x23) || (local_90.size <= uVar14 + 1)) goto LAB_0013e936;
        if (local_90.text[uVar14 + 1] == '*') {
          endIndex = uVar14 + 2;
          local_90.position = endIndex;
          if (local_90.size <= endIndex) {
LAB_0013fb61:
            sVar10 = sysbvm_sourcePosition_createWithIndices
                               (context,local_90.sourceCode,uVar14,endIndex);
            sVar11 = sysbvm_symbol_internWithCString(context,"Incomplete multiline comment.");
            sVar10 = sysbvm_token_createWithKind(context,SYSBVM_TOKEN_KIND_ERROR,sVar10,sVar11);
            sysbvm_orderedCollection_add(context,orderedCollection,sVar10);
            break;
          }
          uVar9 = uVar14 + 4;
          while (((uVar1 = uVar9 - 1, local_90.text[uVar9 - 2] != '*' || (local_90.size <= uVar1))
                 || (local_90.position = uVar9, local_90.text[uVar9 - 1] != '#'))) {
            lVar3 = uVar9 - local_90.size;
            uVar9 = uVar9 + 1;
            endIndex = local_90.size;
            local_90.position = uVar1;
            if (lVar3 == 1) goto LAB_0013fb61;
          }
        }
        else {
          if (local_90.text[uVar14 + 1] != '#') goto LAB_0013e936;
          local_90.position = uVar14 + 2;
          while (uVar9 = local_90.size, local_90.size != local_90.position) {
            puVar2 = local_90.text + local_90.position;
            uVar9 = local_90.position + 1;
            local_90.position = uVar9;
            if ((*puVar2 == '\n') || (*puVar2 == '\r')) break;
          }
        }
      } while( true );
    }
  }
LAB_0013fba4:
  sStack_60 = sysbvm_orderedCollection_asArraySlice(context,local_68);
  sysbvm_gc_unlock(context);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_60;
LAB_0013e936:
  local_b8.size = local_90.size;
  local_b8.position = local_90.position;
  local_b8.sourceCode = local_90.sourceCode;
  local_b8.text = local_90.text;
  if ((bVar4 == 0x5f) || ((uVar13 & 0xffffffdf) - 0x41 < 0x1a)) {
    do {
      local_90.position = uVar14 + 1;
      uVar13 = 0xffffffff;
      if (local_90.position < local_90.size) {
        uVar13 = (uint)local_90.text[uVar14 + 1];
      }
      uVar14 = local_90.position;
    } while ((uVar13 - 0x30 < 10 || uVar13 == 0x5f) || (uVar13 & 0xffffffdf) - 0x41 < 0x1a);
    if (local_90.position < local_90.size) {
LAB_0013ea10:
      if (local_90.text[local_90.position] != ':') goto LAB_0013eab6;
      uVar9 = local_90.position + 1;
      if (uVar9 < local_90.size) {
        if (local_90.text[uVar9] == ':') {
          uVar13 = 0xffffffff;
          if (local_90.position + 2 < local_90.size) {
            uVar13 = (uint)local_90.text[local_90.position + 2];
          }
          if ((uVar13 != 0x5f) && (0x19 < (uVar13 & 0xffffffdf) - 0x41)) goto LAB_0013eba7;
          uVar9 = local_90.position + 3;
          do {
            local_90.position = uVar9;
            uVar13 = 0xffffffff;
            if (local_90.position < local_90.size) {
              uVar13 = (uint)local_90.text[local_90.position];
            }
            uVar9 = local_90.position + 1;
          } while ((uVar13 - 0x30 < 10 || uVar13 == 0x5f) || (uVar13 & 0xffffffdf) - 0x41 < 0x1a);
          if (local_90.size <= local_90.position) goto LAB_0013eab6;
          goto LAB_0013ea10;
        }
LAB_0013eba7:
        if ((local_90.text[uVar9] == ':') && (local_90.position + 2 < local_90.size)) {
          bVar4 = local_90.text[local_90.position + 2];
          if (((0x3d < bVar4 - 0x21) ||
              ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) &&
             ((bVar4 != 0x7e && (bVar4 != 0x7c)))) goto LAB_0013f52e;
          local_90.position = local_90.position + 3;
          uVar9 = local_90.position;
          if (local_90.position < local_90.size) goto LAB_0013ebec;
          goto LAB_0013f255;
        }
      }
LAB_0013f52e:
      sVar7 = SYSBVM_TOKEN_KIND_KEYWORD;
      local_90.position = uVar9;
      do {
        sVar12 = sVar7;
        _Var8 = sysbvm_scanner_advanceKeyword(&local_90);
        sVar5 = local_b8.position;
        sVar7 = SYSBVM_TOKEN_KIND_MULTI_KEYWORD;
      } while (_Var8);
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_b8.sourceCode,local_b8.position,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - sVar5,(char *)(local_b8.text + sVar5));
      goto LAB_0013f84b;
    }
LAB_0013eab6:
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    sVar11 = sysbvm_symbol_internWithString
                       (context,local_90.position - startIndex,(char *)(local_b8.text + startIndex))
    ;
    sVar12 = SYSBVM_TOKEN_KIND_IDENTIFIER;
    goto LAB_0013f84b;
  }
  if (uVar13 - 0x30 < 10) {
LAB_0013e96b:
    uVar9 = uVar14 + 2;
    do {
      local_90.position = uVar9;
      uVar14 = local_90.position - 1;
      if (local_90.size <= uVar14) goto LAB_0013f36f;
      bVar4 = local_90.text[local_90.position - 1];
      uVar9 = local_90.position + 1;
    } while (bVar4 - 0x30 < 10 || bVar4 == 0x5f);
    if (bVar4 == 0x2e) {
      if ((local_90.size <= local_90.position) ||
         ((bVar4 = local_90.text[local_90.position], 9 < bVar4 - 0x30 &&
          (((bVar4 != 0x2d && (bVar4 != 0x2b)) ||
           ((local_90.size <= uVar9 || (9 < local_90.text[uVar9] - 0x30)))))))) goto LAB_0013f36f;
      if ((local_90.size <= uVar9) ||
         ((local_90.text[uVar9] != '+' && (local_90.text[uVar9] != '-')))) {
        uVar9 = local_90.position;
      }
      local_90.position = uVar9 + 1;
      do {
        uVar9 = local_90.position;
        if (local_90.size <= uVar9) goto LAB_0013fb23;
        bVar4 = local_90.text[uVar9];
        local_90.position = uVar9 + 1;
      } while (bVar4 - 0x30 < 10 || bVar4 == 0x5f);
      if ((bVar4 | 0x20) == 0x65) {
        if (local_90.position < local_90.size) {
          if (local_90.text[local_90.position] == '+') goto LAB_0013faee;
          if (local_90.text[local_90.position] == '-') goto LAB_0013faee;
        }
        while( true ) {
          uVar13 = 0xffffffff;
          if (local_90.position < local_90.size) {
            uVar13 = (uint)local_90.text[local_90.position];
          }
          uVar9 = local_90.position;
          if (uVar13 != 0x5f && 9 < uVar13 - 0x30) break;
          uVar9 = local_90.position + 1;
LAB_0013faee:
          local_90.position = uVar9;
        }
      }
LAB_0013fb23:
      local_90.position = uVar9;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_float64_parseString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_FLOAT;
    }
    else if ((bVar4 == 0x72) || (bVar4 == 0x52)) {
      while (((uVar13 = 0xffffffff, local_90.position < local_90.size &&
              (uVar13 = (uint)local_90.text[local_90.position],
              local_90.text[local_90.position] - 0x30 < 10)) ||
             ((uVar13 == 0x5f || ((uVar13 & 0xffffffdf) - 0x41 < 0x1a))))) {
        local_90.position = local_90.position + 1;
      }
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_integer_parseString
                         (context,local_90.position - startIndex,
                          (char *)(local_b8.text + startIndex));
      sVar12 = SYSBVM_TOKEN_KIND_INTEGER;
    }
    else {
LAB_0013f36f:
      local_90.position = uVar14;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,uVar14);
      sVar11 = sysbvm_integer_parseString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_INTEGER;
    }
    goto LAB_0013f84b;
  }
  if (0x5a < bVar4) {
    if (bVar4 < 0x7b) {
      if (uVar13 == 0x5b) {
        local_90.position = uVar14 + 1;
        sVar10 = sysbvm_sourcePosition_createWithIndices
                           (context,local_90.sourceCode,startIndex,local_90.position);
        sVar11 = sysbvm_symbol_internWithString
                           (context,local_90.position - local_b8.position,
                            (char *)(local_b8.text + local_b8.position));
        sVar12 = SYSBVM_TOKEN_KIND_LBRACKET;
        goto LAB_0013f84b;
      }
      if (uVar13 == 0x5d) {
        local_90.position = uVar14 + 1;
        sVar10 = sysbvm_sourcePosition_createWithIndices
                           (context,local_90.sourceCode,startIndex,local_90.position);
        sVar11 = sysbvm_symbol_internWithString
                           (context,local_90.position - local_b8.position,
                            (char *)(local_b8.text + local_b8.position));
        sVar12 = SYSBVM_TOKEN_KIND_RBRACKET;
        goto LAB_0013f84b;
      }
      if (uVar13 != 0x60) goto switchD_0013eb7c_caseD_24;
      if (uVar14 + 1 < local_90.size) {
        bVar4 = local_90.text[uVar14 + 1];
        if (bVar4 < 0x40) {
          if (bVar4 == 0x27) {
            local_90.position = uVar14 + 2;
            sVar10 = sysbvm_sourcePosition_createWithIndices
                               (context,local_90.sourceCode,startIndex,local_90.position);
            sVar11 = sysbvm_symbol_internWithString
                               (context,local_90.position - local_b8.position,
                                (char *)(local_b8.text + local_b8.position));
            sVar12 = SYSBVM_TOKEN_KIND_QUOTE;
          }
          else {
            if (bVar4 != 0x2c) goto LAB_0013f818;
            local_90.position = uVar14 + 2;
            sVar10 = sysbvm_sourcePosition_createWithIndices
                               (context,local_90.sourceCode,startIndex,local_90.position);
            sVar11 = sysbvm_symbol_internWithString
                               (context,local_90.position - local_b8.position,
                                (char *)(local_b8.text + local_b8.position));
            sVar12 = SYSBVM_TOKEN_KIND_QUASI_UNQUOTE;
          }
        }
        else if (bVar4 == 0x40) {
          local_90.position = uVar14 + 2;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_90.sourceCode,startIndex,local_90.position);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_SPLICE;
        }
        else {
          if (bVar4 != 0x60) goto LAB_0013f818;
          local_90.position = uVar14 + 2;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_90.sourceCode,startIndex,local_90.position);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_QUASI_QUOTE;
        }
        goto LAB_0013f84b;
      }
      goto LAB_0013f818;
    }
    if (bVar4 == 0x7b) {
      local_90.position = uVar14 + 1;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_LCBRACKET;
      goto LAB_0013f84b;
    }
    if (uVar13 != 0x7c) {
      if (uVar13 != 0x7d) goto switchD_0013eb7c_caseD_24;
      local_90.position = uVar14 + 1;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_RCBRACKET;
      goto LAB_0013f84b;
    }
    uVar14 = uVar14 + 1;
    local_90.position = uVar14;
    if ((local_90.size <= uVar14) ||
       (_Var8 = sysbvm_scanner_isOperatorCharacter((uint)local_90.text[uVar14]), !_Var8)) {
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_b8.sourceCode,local_b8.position,uVar14);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_BAR;
      goto LAB_0013f84b;
    }
    do {
      bVar4 = puVar6[uVar14];
      if (((0x3d < bVar4 - 0x21) ||
          ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) &&
         ((bVar4 != 0x7e && (uVar9 = uVar14, bVar4 != 0x7c)))) break;
      uVar14 = uVar14 + 1;
      uVar9 = sVar5;
      local_90.position = uVar14;
    } while (sVar5 != uVar14);
    goto LAB_0013f8f5;
  }
  switch(uVar13) {
  case 0x22:
    do {
      while( true ) {
        uVar9 = uVar14;
        local_90.position = uVar9 + 1;
        if (local_90.size <= local_90.position) goto LAB_0013f29c;
        if (local_90.text[local_90.position] != '\\') break;
        local_90.position = uVar9 + 2;
        uVar14 = local_90.position;
        if (local_90.size <= local_90.position) goto LAB_0013f29c;
      }
      uVar14 = local_90.position;
    } while (local_90.text[local_90.position] != '\"');
    local_90.position = uVar9 + 2;
    sVar12 = SYSBVM_TOKEN_KIND_STRING;
    tokenConversionFunction = sysbvm_scanner_tokenAsString;
LAB_0013f768:
    sysbvm_scanner_emitTokenForStateRange
              (context,&local_b8,&local_90,sVar12,tokenConversionFunction,orderedCollection);
    goto LAB_0013f861;
  case 0x23:
    c = 0xffffffff;
    if (uVar14 + 1 < local_90.size) {
      c = (uint)local_90.text[uVar14 + 1];
    }
    if ((c == 0x5f) || ((c & 0xffffffdf) - 0x41 < 0x1a)) {
      uVar9 = uVar14 + 2;
      do {
        local_90.position = uVar9;
        uVar13 = 0xffffffff;
        if (local_90.position < local_90.size) {
          uVar13 = (uint)local_90.text[local_90.position];
        }
        uVar9 = local_90.position + 1;
      } while ((uVar13 - 0x30 < 10 || uVar13 == 0x5f) || (uVar13 & 0xffffffdf) - 0x41 < 0x1a);
      uVar9 = local_90.position;
      if (local_90.position < local_90.size) {
LAB_0013f3ff:
        uVar9 = local_90.position;
        if (local_90.text[local_90.position] == ':') {
          uVar9 = local_90.position + 1;
          if (((local_90.size <= uVar9) || (local_90.text[uVar9] != ':')) ||
             (local_90.position = local_90.position + 2, local_90.size <= local_90.position)) {
LAB_0013f4fc:
            local_90.position = uVar9;
            do {
              _Var8 = sysbvm_scanner_advanceKeyword(&local_90);
              uVar9 = local_90.position;
            } while (_Var8);
            goto LAB_0013f69d;
          }
          bVar4 = local_90.text[local_90.position];
          if ((((bVar4 != 0x5f) && (0x19 < (bVar4 & 0xffffffdf) - 0x41)) &&
              ((0x3d < bVar4 - 0x21 ||
               ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)))) &&
             ((bVar4 != 0x7e && (bVar4 != 0x7c)))) goto LAB_0013f4fc;
          bVar4 = local_90.text[local_90.position];
          if ((((0x3d < bVar4 - 0x21) ||
               ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) &&
              (bVar4 != 0x7c)) && (bVar4 != 0x7e)) goto LAB_0013f49e;
          goto LAB_0013f66c;
        }
      }
    }
    else {
      local_6c = c;
      _Var8 = sysbvm_scanner_isOperatorCharacter(c);
      if (!_Var8) {
        if ((int)local_6c < 0x5b) {
          if (local_6c == 0x22) {
            for (local_90.position = uVar14 + 2; local_90.position < sVar5;
                local_90.position = local_90.position + 1) {
              if (puVar6[local_90.position] == '\\') {
                local_90.position = local_90.position + 1;
                if (sVar5 <= local_90.position) break;
              }
              else if (puVar6[local_90.position] == '\"') {
                local_90.position = local_90.position + 1;
                sVar12 = SYSBVM_TOKEN_KIND_SYMBOL;
                tokenConversionFunction = sysbvm_scanner_tokenAsSymbolString;
                goto LAB_0013f768;
              }
            }
LAB_0013f29c:
            sVar10 = sysbvm_sourcePosition_createWithIndices
                               (context,local_b8.sourceCode,local_b8.position,local_90.position);
            cstring = "Incomplete string.";
            goto LAB_0013f83b;
          }
          if (local_6c != 0x28) goto switchD_0013eb7c_caseD_24;
          local_90.position = uVar14 + 2;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,local_90.position);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_LITERAL_ARRAY_START;
        }
        else if (local_6c == 0x5b) {
          local_90.position = uVar14 + 2;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,local_90.position);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_BYTE_ARRAY_START;
        }
        else {
          if (local_6c != 0x7b) goto switchD_0013eb7c_caseD_24;
          local_90.position = uVar14 + 2;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,local_90.position);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_DICTIONARY_START;
        }
        break;
      }
      local_90.position = uVar14 + 2;
      uVar9 = local_90.position;
      if (local_90.position < sVar5) {
        do {
          bVar4 = puVar6[local_90.position];
          if ((((0x3d < bVar4 - 0x21) ||
               ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) &&
              (bVar4 != 0x7e)) && (uVar9 = local_90.position, bVar4 != 0x7c)) break;
          local_90.position = local_90.position + 1;
          uVar9 = sVar5;
        } while (sVar5 != local_90.position);
      }
    }
LAB_0013f69d:
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_b8.sourceCode,local_b8.position,uVar9);
    sVar11 = sysbvm_symbol_internWithString
                       (context,~local_b8.position + local_90.position,
                        (char *)(local_b8.text + local_b8.position + 1));
    sVar12 = SYSBVM_TOKEN_KIND_SYMBOL;
    break;
  default:
    goto switchD_0013eb7c_caseD_24;
  case 0x27:
    do {
      while( true ) {
        uVar9 = uVar14;
        local_90.position = uVar9 + 1;
        if (local_90.size <= local_90.position) goto LAB_0013f2bf;
        if (local_90.text[local_90.position] == '\\') break;
        uVar14 = local_90.position;
        if (local_90.text[local_90.position] == '\'') {
          local_90.position = uVar9 + 2;
          sVar12 = SYSBVM_TOKEN_KIND_CHARACTER;
          tokenConversionFunction = sysbvm_scanner_tokenAsCharacter;
          goto LAB_0013f768;
        }
      }
      local_90.position = uVar9 + 2;
      uVar14 = local_90.position;
    } while (local_90.position < local_90.size);
LAB_0013f2bf:
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    cstring = "Incomplete character.";
    goto LAB_0013f83b;
  case 0x28:
    local_90.position = uVar14 + 1;
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    sVar11 = sysbvm_symbol_internWithString
                       (context,local_90.position - local_b8.position,
                        (char *)(local_b8.text + local_b8.position));
    sVar12 = SYSBVM_TOKEN_KIND_LPARENT;
    break;
  case 0x29:
    local_90.position = uVar14 + 1;
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    sVar11 = sysbvm_symbol_internWithString
                       (context,local_90.position - local_b8.position,
                        (char *)(local_b8.text + local_b8.position));
    sVar12 = SYSBVM_TOKEN_KIND_RPARENT;
    break;
  case 0x2b:
  case 0x2d:
    if ((uVar14 + 1 < local_90.size) && (local_90.text[uVar14 + 1] - 0x30 < 10)) goto LAB_0013e96b;
    if (uVar13 == 0x2c) goto LAB_0013eed8;
switchD_0013eb7c_caseD_24:
    _Var8 = sysbvm_scanner_isOperatorCharacter(uVar13);
    if (_Var8) {
      do {
        bVar4 = puVar6[uVar14];
        if (((0x3d < bVar4 - 0x21) ||
            ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) &&
           ((bVar4 != 0x7e && (uVar9 = uVar14, bVar4 != 0x7c)))) break;
        uVar14 = uVar14 + 1;
        uVar9 = sVar5;
        local_90.position = uVar14;
      } while (sVar5 != uVar14);
      if (uVar9 - local_b8.position == 1) {
        if (uVar13 == 0x2a) {
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,uVar9);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_STAR;
        }
        else if (uVar13 == 0x3e) {
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,uVar9);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_GREATER_THAN;
        }
        else {
          if (uVar13 != 0x3c) goto LAB_0013f8f5;
          sVar10 = sysbvm_sourcePosition_createWithIndices
                             (context,local_b8.sourceCode,local_b8.position,uVar9);
          sVar11 = sysbvm_symbol_internWithString
                             (context,local_90.position - local_b8.position,
                              (char *)(local_b8.text + local_b8.position));
          sVar12 = SYSBVM_TOKEN_KIND_LESS_THAN;
        }
      }
      else {
LAB_0013f8f5:
        sVar10 = sysbvm_sourcePosition_createWithIndices
                           (context,local_b8.sourceCode,local_b8.position,uVar9);
        sVar11 = sysbvm_symbol_internWithString
                           (context,local_90.position - local_b8.position,
                            (char *)(local_b8.text + local_b8.position));
        sVar12 = SYSBVM_TOKEN_KIND_OPERATOR;
      }
    }
    else {
LAB_0013f818:
      local_90.position = uVar14 + 1;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_b8.sourceCode,local_b8.position,local_90.position);
      cstring = "Unrecognized token.";
LAB_0013f83b:
      sVar11 = sysbvm_symbol_internWithCString(context,cstring);
      sVar12 = SYSBVM_TOKEN_KIND_ERROR;
    }
    break;
  case 0x2c:
LAB_0013eed8:
    local_90.position = uVar14 + 1;
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    sVar11 = sysbvm_symbol_internWithString
                       (context,local_90.position - local_b8.position,
                        (char *)(local_b8.text + local_b8.position));
    sVar12 = SYSBVM_TOKEN_KIND_COMMA;
    break;
  case 0x2e:
    local_90.position = uVar14 + 1;
    if ((((local_90.position < local_90.size) && (local_90.text[local_90.position] == '.')) &&
        (uVar14 + 2 < local_90.size)) && (local_90.text[uVar14 + 2] == '.')) {
      local_90.position = uVar14 + 3;
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_ELLIPSIS;
    }
    else {
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_DOT;
    }
    break;
  case 0x3a:
    local_90.position = uVar14 + 1;
    if (local_90.position < local_90.size) {
      if (local_90.text[local_90.position] == '=') {
        local_90.position = uVar14 + 2;
        sVar10 = sysbvm_sourcePosition_createWithIndices
                           (context,local_90.sourceCode,startIndex,local_90.position);
        sVar11 = sysbvm_symbol_internWithString
                           (context,local_90.position - local_b8.position,
                            (char *)(local_b8.text + local_b8.position));
        sVar12 = SYSBVM_TOKEN_KIND_ASSIGNMENT;
      }
      else {
        if (local_90.text[local_90.position] != ':') goto LAB_0013f314;
        local_90.position = uVar14 + 2;
        sVar10 = sysbvm_sourcePosition_createWithIndices
                           (context,local_90.sourceCode,startIndex,local_90.position);
        sVar11 = sysbvm_symbol_internWithString
                           (context,local_90.position - local_b8.position,
                            (char *)(local_b8.text + local_b8.position));
        sVar12 = SYSBVM_TOKEN_KIND_COLON_COLON;
      }
    }
    else {
LAB_0013f314:
      sVar10 = sysbvm_sourcePosition_createWithIndices
                         (context,local_90.sourceCode,startIndex,local_90.position);
      sVar11 = sysbvm_symbol_internWithString
                         (context,local_90.position - local_b8.position,
                          (char *)(local_b8.text + local_b8.position));
      sVar12 = SYSBVM_TOKEN_KIND_COLON;
    }
    break;
  case 0x3b:
    local_90.position = uVar14 + 1;
    sVar10 = sysbvm_sourcePosition_createWithIndices
                       (context,local_90.sourceCode,startIndex,local_90.position);
    sVar11 = sysbvm_symbol_internWithString
                       (context,local_90.position - local_b8.position,
                        (char *)(local_b8.text + local_b8.position));
    sVar12 = SYSBVM_TOKEN_KIND_SEMICOLON;
  }
LAB_0013f84b:
  sVar10 = sysbvm_token_createWithKind(context,sVar12,sVar10,sVar11);
  sysbvm_orderedCollection_add(context,orderedCollection,sVar10);
LAB_0013f861:
  if (local_90.size <= local_90.position) goto LAB_0013fba4;
  goto LAB_0013e83e;
  while (local_90.position = local_90.position + 1, uVar9 = local_90.size,
        local_90.size != local_90.position) {
LAB_0013ebec:
    bVar4 = local_90.text[local_90.position];
    if ((((0x3d < bVar4 - 0x21) ||
         ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)) && (bVar4 != 0x7e)) &&
       (uVar9 = local_90.position, bVar4 != 0x7c)) break;
  }
LAB_0013f255:
  sVar10 = sysbvm_sourcePosition_createWithIndices(context,local_90.sourceCode,startIndex,uVar9);
  sVar11 = sysbvm_symbol_internWithString
                     (context,local_90.position - local_b8.position,
                      (char *)(local_b8.text + local_b8.position));
  sVar12 = SYSBVM_TOKEN_KIND_OPERATOR;
  goto LAB_0013f84b;
LAB_0013f49e:
  while( true ) {
    uVar13 = 0xffffffff;
    if (local_90.position < local_90.size) {
      uVar13 = (uint)local_90.text[local_90.position];
    }
    if ((9 < uVar13 - 0x30 && uVar13 != 0x5f) && 0x19 < (uVar13 & 0xffffffdf) - 0x41) break;
    local_90.position = local_90.position + 1;
  }
  uVar9 = local_90.position;
  if (local_90.size <= local_90.position) goto LAB_0013f69d;
  goto LAB_0013f3ff;
  while (local_90.position = local_90.position + 1, uVar9 = sVar5,
        local_90.size != local_90.position) {
LAB_0013f66c:
    bVar4 = local_90.text[local_90.position];
    if (((0x3d < bVar4 - 0x21) || ((0x28000000f8005631U >> ((ulong)(bVar4 - 0x21) & 0x3f) & 1) == 0)
        ) && ((bVar4 != 0x7e && (uVar9 = local_90.position, bVar4 != 0x7c)))) break;
  }
  goto LAB_0013f69d;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t tokenList;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);

    gcFrame.tokenList = sysbvm_orderedCollection_create(context);

    if(sysbvm_tuple_isNonNullPointer(sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        if(sysbvm_tuple_isBytes(sourceCodeObject->text))
        {
            sysbvm_scannerState_t scannerState = {
                .sourceCode = sourceCode,
                .text = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCodeObject->text)->bytes,
                .size = sysbvm_tuple_getSizeInBytes(sourceCodeObject->text),
                .position = 0
            };

            while(scannerState.position < scannerState.size)
            {
                if(!sysbvm_scanner_scanNextTokenInto(context, &scannerState, gcFrame.tokenList))
                    break;
            }
        }
    }

    gcFrame.result = sysbvm_orderedCollection_asArraySlice(context, gcFrame.tokenList);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}